

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::print(GroupNode *this,ostream *cout,int depth)

{
  ostream *poVar1;
  void *this_00;
  size_type sVar2;
  reference pvVar3;
  int in_EDX;
  ostream *in_RSI;
  ostream *in_RDI;
  size_t i;
  undefined8 in_stack_ffffffffffffffc8;
  int n;
  ulong local_28;
  
  poVar1 = std::operator<<(in_RSI,"GroupNode @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," { ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  tab(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  poVar1 = std::operator<<(in_RSI,"closed = ");
  this_00 = (void *)std::ostream::operator<<(poVar1,(bool)((byte)in_RDI[0x58] & 1));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    *)(in_RDI + 0x68));
    n = (int)(local_28 >> 0x20);
    if (sVar2 <= local_28) break;
    tab(in_RDI,n);
    poVar1 = std::operator<<(in_RSI,"child");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
    std::operator<<(poVar1," = ");
    pvVar3 = std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                           *)(in_RDI + 0x68),local_28);
    (*(pvVar3->ptr->super_RefCount)._vptr_RefCount[4])(pvVar3->ptr,in_RSI,(ulong)(in_EDX + 1));
    local_28 = local_28 + 1;
  }
  tab(in_RDI,n);
  poVar1 = std::operator<<(in_RSI,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::GroupNode::print(std::ostream& cout, int depth)
  {
    cout << "GroupNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    for (size_t i=0; i<children.size(); i++) {
      tab(cout, depth+1); cout << "child" << i << " = "; children[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }